

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf1_sync_alleles(bcf1_t *line,kstring_t *str)

{
  size_t sVar1;
  int local_1c;
  int i;
  kstring_t *str_local;
  bcf1_t *line_local;
  
  for (local_1c = 0;
      local_1c < (int)((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x10) & 0xffff);
      local_1c = local_1c + 1) {
    sVar1 = strlen((line->d).allele[local_1c]);
    bcf_enc_vchar(str,(int)sVar1,(line->d).allele[local_1c]);
  }
  if ((line->rlen == 0) && ((*(ulong *)&line->field_0x10 >> 0x10 & 0xffff) != 0)) {
    sVar1 = strlen(*(line->d).allele);
    line->rlen = (int32_t)sVar1;
  }
  return;
}

Assistant:

static inline int _bcf1_sync_alleles(const bcf_hdr_t *hdr, bcf1_t *line, int nals)
{
    line->d.shared_dirty |= BCF1_DIRTY_ALS;

    line->n_allele = nals;
    hts_expand(char*, line->n_allele, line->d.m_allele, line->d.allele);

    char *als = line->d.als;
    int n = 0;
    while (n<nals)
    {
        line->d.allele[n] = als;
        while ( *als ) als++;
        als++;
        n++;
    }
    return 0;
}